

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_literal_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  value_type *pvVar1;
  error_type *v;
  basic_value<toml::type_config> *v_00;
  basic_value<toml::type_config> *ctx_00;
  type val;
  string_type local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  val_res;
  location first;
  type reg;
  region local_270;
  basic_value<toml::type_config> local_208;
  basic_value<toml::type_config> local_140;
  
  location::location(&first,loc);
  parse_literal_string_only<toml::type_config>(&val_res,loc,ctx);
  if (val_res.is_ok_ == false) {
    v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
        ::unwrap_err(&val_res,(source_location)0x46a178);
    err<toml::error_info>((failure<toml::error_info> *)&stack0xffffffffffffff88,v);
    ctx_00 = (basic_value<toml::type_config> *)&stack0xffffffffffffff88;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&stack0xffffffffffffff88);
    error_info::~error_info((error_info *)&stack0xffffffffffffff88);
  }
  else {
    pvVar1 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&val_res,(source_location)0x46a190);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar1);
    pvVar1 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&val_res,(source_location)0x46a1a8);
    region::region(&reg,&pvVar1->second);
    local_3e8._M_string_length = val._M_string_length;
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)val._M_dataplus._M_p == &val.field_2) {
      local_3e8.field_2._8_8_ = val.field_2._8_8_;
    }
    else {
      local_3e8._M_dataplus._M_p = val._M_dataplus._M_p;
    }
    val._M_string_length = 0;
    val.field_2._M_local_buf[0] = '\0';
    local_3c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    val._M_dataplus._M_p = (pointer)&val.field_2;
    region::region(&local_270,&reg);
    basic_value<toml::type_config>::basic_value
              (&local_208,&local_3e8,(string_format_info)0x1,&local_3c8,&local_270);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_140,(toml *)&local_208,v_00)
    ;
    ctx_00 = &local_140;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(success_type *)ctx_00);
    basic_value<toml::type_config>::~basic_value(&local_140);
    basic_value<toml::type_config>::~basic_value(&local_208);
    region::~region(&local_270);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    region::~region(&reg);
    std::__cxx11::string::~string((string *)&val);
  }
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  ::cleanup(&val_res,(EVP_PKEY_CTX *)ctx_00);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_literal_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    string_format_info fmt;
    fmt.fmt = string_format::literal;

    auto val_res = parse_literal_string_only(loc, ctx);
    if(val_res.is_err())
    {
        return err(std::move(val_res.unwrap_err()));
    }
    auto val = std::move(val_res.unwrap().first );
    auto reg = std::move(val_res.unwrap().second);

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}